

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O0

void __thiscall
absl::log_internal::LogMessage::CopyToEncodedBuffer<(absl::log_internal::LogMessage::StringType)1>
          (LogMessage *this,string_view str)

{
  string_view value;
  bool bVar1;
  pointer pLVar2;
  size_t sVar3;
  size_type sVar4;
  pointer pLVar5;
  size_type sVar6;
  Span<char> *buf;
  Span<char> SVar7;
  log_internal *local_40;
  Span<char> start;
  Span<char> encoded_remaining_copy;
  LogMessage *this_local;
  string_view str_local;
  
  str_local._M_len = (size_t)str._M_str;
  this_local = (LogMessage *)str._M_len;
  pLVar2 = std::
           unique_ptr<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
           ::operator->(&this->data_);
  start.len_ = (size_type)(pLVar2->encoded_remaining).ptr_;
  sVar6 = (pLVar2->encoded_remaining).len_;
  sVar3 = BufferSizeFor<>(kLengthDelimited);
  sVar4 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  SVar7 = EncodeMessageStart(7,sVar3 + sVar4,(Span<char> *)&start.len_);
  value._M_str = (char *)str_local._M_len;
  value._M_len = (size_t)this_local;
  buf = (Span<char> *)&start.len_;
  bVar1 = EncodeStringTruncate(1,value,buf);
  if (bVar1) {
    local_40 = (log_internal *)SVar7.ptr_;
    start.ptr_ = (pointer)SVar7.len_;
    SVar7.len_ = (size_type)&start.len_;
    SVar7.ptr_ = start.ptr_;
    EncodeMessageLength(local_40,SVar7,buf);
    pLVar2 = std::
             unique_ptr<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    (pLVar2->encoded_remaining).ptr_ = (pointer)start.len_;
    (pLVar2->encoded_remaining).len_ = sVar6;
  }
  else {
    pLVar2 = std::
             unique_ptr<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    pLVar5 = std::
             unique_ptr<absl::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::log_internal::LogMessage::LogMessageData>_>
             ::operator->(&this->data_);
    sVar6 = Span<char>::size(&pLVar5->encoded_remaining);
    Span<char>::remove_suffix(&pLVar2->encoded_remaining,sVar6);
  }
  return;
}

Assistant:

void LogMessage::CopyToEncodedBuffer(absl::string_view str) {
  auto encoded_remaining_copy = data_->encoded_remaining;
  auto start = EncodeMessageStart(
      EventTag::kValue, BufferSizeFor(WireType::kLengthDelimited) + str.size(),
      &encoded_remaining_copy);
  // If the `logging.proto.Event.value` field header did not fit,
  // `EncodeMessageStart` will have zeroed `encoded_remaining_copy`'s size and
  // `EncodeStringTruncate` will fail too.
  if (EncodeStringTruncate(str_type == StringType::kLiteral
                               ? ValueTag::kStringLiteral
                               : ValueTag::kString,
                           str, &encoded_remaining_copy)) {
    // The string may have been truncated, but the field header fit.
    EncodeMessageLength(start, &encoded_remaining_copy);
    data_->encoded_remaining = encoded_remaining_copy;
  } else {
    // The field header(s) did not fit; zero `encoded_remaining` so we don't
    // write anything else later.
    data_->encoded_remaining.remove_suffix(data_->encoded_remaining.size());
  }
}